

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler * llama_sampler_penalties_clone(llama_sampler *smpl)

{
  int32_t *piVar1;
  llama_sampler_context_t pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  llama_sampler *plVar6;
  
  piVar1 = (int32_t *)smpl->ctx;
  plVar6 = llama_sampler_init_penalties(*piVar1,(float)piVar1[1],(float)piVar1[2],(float)piVar1[3]);
  pvVar2 = plVar6->ctx;
  uVar3 = *(undefined8 *)(piVar1 + 6);
  uVar4 = *(undefined8 *)(piVar1 + 8);
  uVar5 = *(undefined8 *)(piVar1 + 10);
  *(undefined8 *)((long)pvVar2 + 0x10) = *(undefined8 *)(piVar1 + 4);
  *(undefined8 *)((long)pvVar2 + 0x18) = uVar3;
  *(undefined8 *)((long)pvVar2 + 0x20) = uVar4;
  *(undefined8 *)((long)pvVar2 + 0x28) = uVar5;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)((long)pvVar2 + 0x30),
             (vector<int,_std::allocator<int>_> *)(piVar1 + 0xc));
  return plVar6;
}

Assistant:

static struct llama_sampler * llama_sampler_penalties_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_penalties *) smpl->ctx;
    auto * result = llama_sampler_init_penalties(
            ctx->penalty_last_n,
            ctx->penalty_repeat,
            ctx->penalty_freq,
            ctx->penalty_present);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_penalties *) result->ctx;

        result_ctx->prev = ctx->prev;
    }

    return result;
}